

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::tryRead
          (AsyncPipe *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  AsyncIoStream *in_R8;
  Promise<unsigned_long> PVar2;
  ArrayPtr<unsigned_char> local_48;
  AsyncIoStream *local_38;
  AsyncIoStream *s;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  AsyncPipe *this_local;
  PromiseNode *pPVar1;
  
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  buffer_local = buffer;
  this_local = this;
  if (maxBytes == 0) {
    Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,0);
    pPVar1 = extraout_RDX;
  }
  else {
    s = in_R8;
    local_38 = _::readMaybe<kj::AsyncIoStream>((Maybe<kj::AsyncIoStream_&> *)((long)buffer + 0x20));
    if (local_38 == (AsyncIoStream *)0x0) {
      local_48 = arrayPtr<unsigned_char>((uchar *)minBytes_local,(size_t)s);
      PVar2 = newAdaptedPromise<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead,kj::(anonymous_namespace)::AsyncPipe&,kj::ArrayPtr<unsigned_char>,unsigned_long&>
                        ((kj *)this,(AsyncPipe *)buffer,&local_48,&maxBytes_local);
      pPVar1 = PVar2.super_PromiseBase.node.ptr;
    }
    else {
      (*(local_38->super_AsyncInputStream)._vptr_AsyncInputStream[1])
                (this,local_38,minBytes_local,maxBytes_local,s);
      pPVar1 = extraout_RDX_00;
    }
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (minBytes == 0) {
      return size_t(0);
    } else KJ_IF_MAYBE(s, state) {
      return s->tryRead(buffer, minBytes, maxBytes);
    } else {
      return newAdaptedPromise<size_t, BlockedRead>(
          *this, arrayPtr(reinterpret_cast<byte*>(buffer), maxBytes), minBytes);
    }